

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to,
          vector<spv::Decoration,_std::allocator<spv::Decoration>_> *decorations_to_copy)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pOVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  __normal_iterator<const_spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
  _Var6;
  Instruction *pIVar7;
  ulong uVar8;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  uint uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  pointer ppIVar14;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  _Hash_node_base *local_50;
  IRContext *local_48;
  DecorationManager *local_40;
  _Hash_node_base *local_38;
  
  uVar8 = (this->id_to_decoration_insts_)._M_h._M_bucket_count;
  uVar9 = (ulong)from % uVar8;
  p_Var12 = (this->id_to_decoration_insts_)._M_h._M_buckets[uVar9];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var10 = p_Var12->_M_nxt, p_Var13 = p_Var12, *(uint32_t *)&p_Var12->_M_nxt[1]._M_nxt != from)
     ) {
    while (p_Var12 = p_Var10, p_Var10 = p_Var12->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar8 != uVar9) ||
         (p_Var13 = p_Var12, *(uint *)&p_Var10[1]._M_nxt == from)) goto LAB_0055b981;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0055b981:
  if (p_Var13 == (__node_base_ptr)0x0) {
    local_50 = (_Hash_node_base *)0x0;
  }
  else {
    local_50 = p_Var13->_M_nxt;
  }
  if (local_50 != (_Hash_node_base *)0x0) {
    p_Var10 = local_50[2]._M_nxt;
    local_38 = local_50[3]._M_nxt;
    if (p_Var10 != local_38) {
      local_48 = this->module_->context_;
      local_40 = this;
      do {
        pIVar7 = (Instruction *)p_Var10->_M_nxt;
        pDVar1 = (decorations_to_copy->
                 super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pDVar2 = (decorations_to_copy->
                 super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar11 = (pIVar7->has_result_id_ & 1) + 1;
        if (pIVar7->has_type_id_ == false) {
          uVar11 = (uint)pIVar7->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(pIVar7,uVar11 + 1);
        this = local_40;
        local_78._0_4_ = uVar5;
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<spv::Decoration_const*,std::vector<spv::Decoration,std::allocator<spv::Decoration>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Decoration_const>>
                          (pDVar1,pDVar2,local_78);
        if (_Var6._M_current !=
            (decorations_to_copy->
            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          pIVar7 = Instruction::Clone(pIVar7,this->module_->context_);
          local_78._0_8_ = &PTR__SmallVector_00b15d78;
          local_78._24_8_ = local_78 + 0x10;
          local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_78._8_8_ = (pointer)0x1;
          uVar8 = (ulong)(pIVar7->has_result_id_ & 1) + 1;
          if (pIVar7->has_type_id_ == false) {
            uVar8 = (ulong)pIVar7->has_result_id_;
          }
          pOVar3 = (pIVar7->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = ((long)(pIVar7->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                  -0x5555555555555555;
          local_78._16_4_ = to;
          if (uVar9 < uVar8 || uVar9 - uVar8 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)
                     ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                     (ulong)(uint)((int)uVar8 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_78);
          local_78._0_8_ = &PTR__SmallVector_00b15d78;
          if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_58,local_58._M_head_impl);
          }
          utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                    (&(this->module_->annotations_).super_IntrusiveList<spvtools::opt::Instruction>,
                     pIVar7);
          IRContext::AnalyzeUses
                    (local_48,(this->module_->annotations_).
                              super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                              super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
        }
        p_Var10 = p_Var10 + 1;
      } while (p_Var10 != local_38);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_78,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)(local_50 + 5));
    uVar4 = local_78._8_8_;
    for (ppIVar14 = (pointer)local_78._0_8_; ppIVar14 != (pointer)uVar4; ppIVar14 = ppIVar14 + 1) {
      pIVar7 = *ppIVar14;
      if (pIVar7->opcode_ != OpGroupDecorate) {
        if (pIVar7->opcode_ == OpGroupMemberDecorate) {
          __assert_fail("false && \"The source id is not suppose to be a type.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x252,
                        "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t, const std::vector<spv::Decoration> &)"
                       );
        }
        __assert_fail("false && \"Unexpected decoration instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x256,
                      "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t, const std::vector<spv::Decoration> &)"
                     );
      }
      uVar5 = (pIVar7->has_result_id_ & 1) + 1;
      if (pIVar7->has_type_id_ == false) {
        uVar5 = (uint)pIVar7->has_result_id_;
      }
      uVar5 = Instruction::GetSingleWordOperand(pIVar7,uVar5);
      CloneDecorations(this,uVar5,to,decorations_to_copy);
    }
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,
                      CONCAT44(local_78._20_4_,local_78._16_4_) - local_78._0_8_);
    }
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(
    uint32_t from, uint32_t to,
    const std::vector<spv::Decoration>& decorations_to_copy) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    if (std::find(decorations_to_copy.begin(), decorations_to_copy.end(),
                  spv::Decoration(inst->GetSingleWordInOperand(1))) ==
        decorations_to_copy.end()) {
      continue;
    }

    // Clone decoration and change |target-id| to |to|.
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }

  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        CloneDecorations(inst->GetSingleWordInOperand(0), to,
                         decorations_to_copy);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        assert(false && "The source id is not suppose to be a type.");
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}